

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O1

void __thiscall
ParticleArrayTest_IndexAccess_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>::
TestBody(ParticleArrayTest_IndexAccess_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>
         *this)

{
  double *pdVar1;
  short sVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  PositionType minPosition;
  PositionType maxPosition;
  AssertionResult gtest_ar;
  int numParticles;
  ParticleArray particles;
  ParticleArray constParticles;
  ParticleType particleArray [15];
  AssertHelper local_4d8;
  AssertionResult local_4d0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c0 [2];
  int local_4ac;
  vector<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  local_4a8;
  double local_488;
  double local_480;
  AssertHelper local_478;
  Particle local_470;
  double local_430 [7];
  double adStack_3f8 [5];
  undefined8 uStack_3ce;
  short asStack_3c0 [456];
  
  local_4a8.
  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.
  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Particle<(pica::Dimension)2> *)0x0;
  local_4a8.
  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Particle<(pica::Dimension)2> *)0x0;
  local_4ac = 0xf;
  lVar4 = 0x38;
  do {
    *(undefined8 *)((long)local_430 + lVar4 + 0x10) = 0;
    *(undefined8 *)((long)local_430 + lVar4 + 0x18) = 0;
    *(undefined8 *)((long)local_430 + lVar4) = 0;
    *(undefined8 *)((long)local_430 + lVar4 + 8) = 0;
    *(undefined8 *)((long)local_430 + lVar4 + 0x20) = 0;
    *(undefined8 *)((long)local_430 + lVar4 + 0x28) = 0x3ff0000000000000;
    *(undefined8 *)((long)adStack_3f8 + lVar4 + -8) = 0x3ff0000000000000;
    *(undefined2 *)((long)adStack_3f8 + lVar4) = 0;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x3f8);
  lVar4 = 0;
  do {
    minPosition.y = -10.0;
    minPosition.x = -10.0;
    maxPosition.y = 10.0;
    maxPosition.x = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (&local_470,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this,
               minPosition,maxPosition);
    *(ulong *)((long)&uStack_3ce + lVar4) =
         CONCAT26(local_470.invGamma._0_2_,local_470.factor._2_6_);
    *(ulong *)(&stack0xfffffffffffffc3a + lVar4) =
         CONCAT26(local_470.typeIndex,local_470.invGamma._2_6_);
    *(double *)((long)adStack_3f8 + lVar4 + 0x20) = local_470.p.z;
    *(ulong *)(&stack0xfffffffffffffc30 + lVar4) =
         CONCAT62(local_470.factor._2_6_,local_470.factor._0_2_);
    *(double *)((long)adStack_3f8 + lVar4 + 0x10) = local_470.p.x;
    *(double *)((long)adStack_3f8 + lVar4 + 0x18) = local_470.p.y;
    *(double *)((long)adStack_3f8 + lVar4) = local_470.position.x;
    *(double *)((long)adStack_3f8 + lVar4 + 8) = local_470.position.y;
    if (local_4a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_4a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<pica::Particle<(pica::Dimension)2>,std::allocator<pica::Particle<(pica::Dimension)2>>>
      ::_M_realloc_insert<pica::Particle<(pica::Dimension)2>const&>
                ((vector<pica::Particle<(pica::Dimension)2>,std::allocator<pica::Particle<(pica::Dimension)2>>>
                  *)&local_4a8,
                 (iterator)
                 local_4a8.
                 super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_470);
    }
    else {
      (local_4a8.
       super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->invGamma =
           (GammaType)CONCAT62(local_470.invGamma._2_6_,local_470.invGamma._0_2_);
      *(ulong *)&(local_4a8.
                  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->typeIndex =
           CONCAT62(local_470._58_6_,local_470.typeIndex);
      ((local_4a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).z = local_470.p.z;
      (local_4a8.
       super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->factor =
           (FactorType)CONCAT62(local_470.factor._2_6_,local_470.factor._0_2_);
      ((local_4a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).x = local_470.p.x;
      ((local_4a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).y = local_470.p.y;
      ((local_4a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->position).x = local_470.position.x;
      ((local_4a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->position).y = local_470.position.y;
      local_4a8.
      super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_4a8.
           super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x3c0);
  std::
  vector<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>::
  vector((vector<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
          *)&local_470,&local_4a8);
  local_4c0[0].ptr_._0_4_ =
       (int)((ulong)((long)local_4a8.
                           super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_4a8.
                          super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 6);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_4d0,"numParticles","particles.size()",&local_4ac,(int *)local_4c0);
  if (local_4d0.success_ == false) {
    testing::Message::Message((Message *)local_4c0);
    if (local_4d0.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_4d0.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x56,pcVar7);
    testing::internal::AssertHelper::operator=(&local_4d8,(Message *)local_4c0);
    testing::internal::AssertHelper::~AssertHelper(&local_4d8);
    if (local_4c0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_4c0[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_4c0[0].ptr_ + 8))();
      }
      local_4c0[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_4d0.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_4d0.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_4c0[0].ptr_._0_4_ =
         (int)((ulong)((long)local_470.position.y - (long)local_470.position.x) >> 6);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_4d0,"numParticles","constParticles.size()",&local_4ac,
               (int *)local_4c0);
    if (local_4d0.success_ == false) {
      testing::Message::Message((Message *)local_4c0);
      if (local_4d0.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_4d0.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x57,pcVar7);
      testing::internal::AssertHelper::operator=(&local_4d8,(Message *)local_4c0);
      testing::internal::AssertHelper::~AssertHelper(&local_4d8);
      if (local_4c0[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_4c0[0].ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_4c0[0].ptr_ + 8))();
        }
        local_4c0[0].ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_4d0.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_4d0.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar4 = 0;
      do {
        local_430[0] = *(double *)((long)adStack_3f8 + lVar4);
        local_480 = *(double *)((long)adStack_3f8 + lVar4 + 8);
        local_430[5] = *(double *)((long)adStack_3f8 + lVar4 + 0x10);
        local_430[6] = 0.0;
        local_430[3] = *(double *)((long)adStack_3f8 + lVar4 + 0x18);
        local_430[4] = 0.0;
        local_430[1] = *(double *)((long)adStack_3f8 + lVar4 + 0x20);
        local_430[2] = 0.0;
        local_488 = *(double *)(&stack0xfffffffffffffc30 + lVar4);
        sVar2 = *(short *)((long)asStack_3c0 + lVar4);
        pdVar1 = (double *)
                 ((long)&((local_4a8.
                           super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->position).x + lVar4);
        if ((((local_430[0] != *pdVar1) || (NAN(local_430[0]) || NAN(*pdVar1))) ||
            (pdVar1 = (double *)
                      ((long)&((local_4a8.
                                super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->position).y + lVar4),
            local_480 != *pdVar1)) || (NAN(local_480) || NAN(*pdVar1))) {
LAB_00199ee3:
          local_4d0.success_ = false;
LAB_00199ef1:
          local_4d0.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_4d8);
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)local_4c0,&local_4d0,
                     "this->eqParticles_(particleArray[i], particles[i])","false","true");
          testing::internal::AssertHelper::AssertHelper
                    (&local_478,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                     ,0x59,(char *)local_4c0[0].ptr_);
          testing::internal::AssertHelper::operator=(&local_478,(Message *)&local_4d8);
          testing::internal::AssertHelper::~AssertHelper(&local_478);
          if (local_4c0[0].ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete__(local_4c0[0].ptr_);
          }
          if (local_4d8.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_4d8.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_4d8.data_ + 8))();
            }
            local_4d8.data_ = (AssertHelperData *)0x0;
          }
        }
        else {
          lVar6 = (long)sVar2 * 0x10;
          dVar9 = *(double *)(pica::ParticleTypes::types + lVar6);
          lVar5 = (long)*(short *)((long)&(local_4a8.
                                           super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->typeIndex +
                                  lVar4) * 0x10;
          dVar11 = *(double *)(pica::ParticleTypes::types + lVar5);
          dVar8 = local_430[5] * 29979245800.0 * dVar9;
          dVar10 = *(double *)
                    ((long)&((local_4a8.
                              super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->p).x + lVar4) *
                   29979245800.0 * dVar11;
          if (((dVar8 != dVar10) || (NAN(dVar8) || NAN(dVar10))) ||
             ((dVar8 = local_430[3] * 29979245800.0 * dVar9,
              dVar10 = *(double *)
                        ((long)&((local_4a8.
                                  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->p).y + lVar4) *
                       29979245800.0 * dVar11, dVar8 != dVar10 || (NAN(dVar8) || NAN(dVar10)))))
          goto LAB_00199ee3;
          if (((dVar9 != dVar11) || (NAN(dVar9) || NAN(dVar11))) ||
             ((dVar9 = local_430[1] * 29979245800.0 * dVar9,
              dVar11 = *(double *)
                        ((long)&((local_4a8.
                                  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->p).z + lVar4) *
                       29979245800.0 * dVar11, dVar9 != dVar11 ||
              (((NAN(dVar9) || NAN(dVar11) ||
                (dVar9 = *(double *)(pica::ParticleTypes::types + 8 + lVar6),
                pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar5), dVar9 != *pdVar1)) ||
               (NAN(dVar9) || NAN(*pdVar1))))))) goto LAB_00199ee3;
          dVar9 = *(double *)
                   ((long)&(local_4a8.
                            super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->factor + lVar4);
          local_4d0.success_ = local_488 == dVar9;
          local_4d0.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((local_488 != dVar9) || (NAN(local_488) || NAN(dVar9))) goto LAB_00199ef1;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_4d0.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if ((((local_430[0] != *(double *)((long)local_470.position.x + lVar4)) ||
             (NAN(local_430[0]) || NAN(*(double *)((long)local_470.position.x + lVar4)))) ||
            (pdVar1 = (double *)((long)local_470.position.x + lVar4 + 8), local_480 != *pdVar1)) ||
           (NAN(local_480) || NAN(*pdVar1))) {
LAB_0019a0d2:
          local_4d0.success_ = false;
LAB_0019a0e0:
          local_4d0.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_4d8);
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)local_4c0,&local_4d0,
                     "this->eqParticles_(particleArray[i], constParticles[i])","false","true");
          testing::internal::AssertHelper::AssertHelper
                    (&local_478,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                     ,0x5a,(char *)local_4c0[0].ptr_);
          testing::internal::AssertHelper::operator=(&local_478,(Message *)&local_4d8);
          testing::internal::AssertHelper::~AssertHelper(&local_478);
          if (local_4c0[0].ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete__(local_4c0[0].ptr_);
          }
          if (local_4d8.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_4d8.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_4d8.data_ + 8))();
            }
            local_4d8.data_ = (AssertHelperData *)0x0;
          }
        }
        else {
          lVar6 = (long)sVar2 * 0x10;
          dVar9 = *(double *)(pica::ParticleTypes::types + lVar6);
          lVar5 = (long)*(short *)((long)local_470.position.x + lVar4 + 0x38) * 0x10;
          dVar11 = *(double *)(pica::ParticleTypes::types + lVar5);
          dVar8 = local_430[5] * 29979245800.0 * dVar9;
          dVar10 = *(double *)((long)local_470.position.x + lVar4 + 0x10) * 29979245800.0 * dVar11;
          if (((dVar8 != dVar10) || (NAN(dVar8) || NAN(dVar10))) ||
             ((dVar8 = local_430[3] * 29979245800.0 * dVar9,
              dVar10 = *(double *)((long)local_470.position.x + lVar4 + 0x18) * 29979245800.0 *
                       dVar11, dVar8 != dVar10 || (NAN(dVar8) || NAN(dVar10))))) goto LAB_0019a0d2;
          if (((dVar9 != dVar11) || (NAN(dVar9) || NAN(dVar11))) ||
             ((dVar9 = local_430[1] * 29979245800.0 * dVar9,
              dVar11 = *(double *)((long)local_470.position.x + lVar4 + 0x20) * 29979245800.0 *
                       dVar11, dVar9 != dVar11 ||
              (((NAN(dVar9) || NAN(dVar11) ||
                (dVar9 = *(double *)(pica::ParticleTypes::types + 8 + lVar6),
                pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar5), dVar9 != *pdVar1)) ||
               (NAN(dVar9) || NAN(*pdVar1))))))) goto LAB_0019a0d2;
          dVar9 = *(double *)((long)local_470.position.x + lVar4 + 0x28);
          local_4d0.success_ = local_488 == dVar9;
          local_4d0.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((local_488 != dVar9) || (NAN(local_488) || NAN(dVar9))) goto LAB_0019a0e0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_4d0.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar4 = lVar4 + 0x40;
      } while (lVar4 != 0x3c0);
    }
  }
  if ((void *)local_470.position.x != (void *)0x0) {
    operator_delete((void *)local_470.position.x,(long)local_470.p.x - (long)local_470.position.x);
  }
  if (local_4a8.
      super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4a8.
                    super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4a8.
                          super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4a8.
                          super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, IndexAccess)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    const int numParticles = 15;
    ParticleType particleArray[numParticles];
    for (int i = 0; i < numParticles; i++) {
        ParticleType particle = this->randomParticle();
        particleArray[i] = particle;
        particles.pushBack(particle);
    }
    const ParticleArray constParticles = particles;
    ASSERT_EQ(numParticles, particles.size());
    ASSERT_EQ(numParticles, constParticles.size());
    for (int i = 0; i < numParticles; i++) {
        EXPECT_TRUE(this->eqParticles_(particleArray[i], particles[i]));
        EXPECT_TRUE(this->eqParticles_(particleArray[i], constParticles[i]));
    }
}